

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardEuler.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::integrators::ForwardEuler::oneStepIntegration
          (ForwardEuler *this,double t0,double dT,VectorDynSize *x0,VectorDynSize *x)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  element_type *peVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  Index size;
  size_t sVar8;
  size_t sVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  string *psVar14;
  Index index;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  char *pcVar18;
  
  if ((this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
      super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    pcVar18 = "First you have to specify a dynamical system";
  }
  else {
    sVar8 = iDynTree::VectorDynSize::size();
    sVar9 = DynamicalSystem::stateSpaceSize
                      ((this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                       super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar8 == sVar9) {
      sVar8 = iDynTree::VectorDynSize::size();
      sVar9 = DynamicalSystem::stateSpaceSize
                        ((this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                         super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
      if (sVar8 != sVar9) {
        DynamicalSystem::stateSpaceSize
                  ((this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                   super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        iDynTree::VectorDynSize::resize((ulong)x);
      }
      peVar4 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
               super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      iVar7 = (*peVar4->_vptr_DynamicalSystem[2])(t0,peVar4,x0,&this->m_computationBuffer);
      if ((char)iVar7 != '\0') {
        lVar10 = iDynTree::VectorDynSize::data();
        iDynTree::VectorDynSize::size();
        lVar11 = iDynTree::VectorDynSize::data();
        iDynTree::VectorDynSize::size();
        uVar12 = iDynTree::VectorDynSize::data();
        uVar13 = iDynTree::VectorDynSize::size();
        uVar15 = uVar13;
        if (((uVar12 & 7) == 0) &&
           (uVar15 = (ulong)((uint)(uVar12 >> 3) & 1), (long)uVar13 <= (long)uVar15)) {
          uVar15 = uVar13;
        }
        lVar16 = uVar13 - uVar15;
        if (0 < (long)uVar15) {
          uVar17 = 0;
          do {
            *(double *)(uVar12 + uVar17 * 8) =
                 *(double *)(lVar11 + uVar17 * 8) * dT + *(double *)(lVar10 + uVar17 * 8);
            uVar17 = uVar17 + 1;
          } while (uVar15 != uVar17);
        }
        uVar17 = (lVar16 - (lVar16 >> 0x3f) & 0xfffffffffffffffeU) + uVar15;
        if (1 < lVar16) {
          do {
            pdVar1 = (double *)(lVar10 + uVar15 * 8);
            dVar5 = pdVar1[1];
            pdVar2 = (double *)(lVar11 + uVar15 * 8);
            dVar6 = pdVar2[1];
            pdVar3 = (double *)(uVar12 + uVar15 * 8);
            *pdVar3 = *pdVar2 * dT + *pdVar1;
            pdVar3[1] = dVar6 * dT + dVar5;
            uVar15 = uVar15 + 2;
          } while ((long)uVar15 < (long)uVar17);
        }
        if ((long)uVar13 <= (long)uVar17) {
          return true;
        }
        do {
          *(double *)(uVar12 + uVar17 * 8) =
               *(double *)(lVar11 + uVar17 * 8) * dT + *(double *)(lVar10 + uVar17 * 8);
          uVar17 = uVar17 + 1;
        } while (uVar13 != uVar17);
        return true;
      }
      pcVar18 = "Error while evaluating the autonomous dynamics.";
    }
    else {
      pcVar18 = "Wrong initial state dimension.";
    }
  }
  psVar14 = IntegratorInfo::name_abi_cxx11_
                      (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
  iDynTree::reportError((psVar14->_M_dataplus)._M_p,"oneStepIntegration",pcVar18);
  return false;
}

Assistant:

bool ForwardEuler::oneStepIntegration(double t0, double dT, const VectorDynSize &x0, VectorDynSize &x)
            {
                if (!m_dynamicalSystem_ptr) {
                    reportError(m_info.name().c_str(), "oneStepIntegration", "First you have to specify a dynamical system");
                    return false;
                }

                if (x0.size() != m_dynamicalSystem_ptr->stateSpaceSize()){
                    reportError(m_info.name().c_str(), "oneStepIntegration", "Wrong initial state dimension.");
                    return false;
                }

                if (x.size() != m_dynamicalSystem_ptr->stateSpaceSize()){
                    x.resize(static_cast<unsigned int>(m_dynamicalSystem_ptr->stateSpaceSize()));
                }

                if (!m_dynamicalSystem_ptr->dynamics(x0, t0, m_computationBuffer)){
                    reportError(m_info.name().c_str(), "oneStepIntegration", "Error while evaluating the autonomous dynamics.");
                    return false;
                }

                toEigen(x) = toEigen(x0) + dT * toEigen(m_computationBuffer);

                return true;
            }